

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

uint32 __thiscall
Clasp::Asp::LogicProgram::findBody
          (LogicProgram *this,uint32 hash,Body_t type,uint32 size,weight_t bound,WeightLit_t *sum)

{
  uint uVar1;
  uint uVar2;
  PrgBody *rhs;
  _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> _Var3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var8;
  bool bVar9;
  LogicProgram *this_00;
  ulong uVar10;
  uint uVar11;
  IndexIter it;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>_>
  pVar12;
  uint32 local_44;
  WeightLitSpan local_40;
  _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> _Var7;
  
  local_44 = hash;
  pVar12 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                          *)this->index_,&local_44);
  _Var7 = pVar12.second.
          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
  if (type.val_ == Normal) {
    bound = size;
  }
  if ((__node_type *)
      pVar12.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
      _M_cur != _Var7.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur) {
    uVar6 = (ulong)size;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; size >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    bVar9 = false;
    do {
      _Var8._M_cur = (__node_type *)
                     pVar12.second.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                     _M_cur;
      rhs = (this->bodies_).ebo_.buf
            [*(uint *)((long)pVar12.first.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                      + 0xc)];
      this_00 = this;
      bVar5 = checkBody(this,rhs,type,size,bound);
      if (bVar5) {
        uVar1 = *(uint *)&rhs->field_0x8;
        if ((uVar1 & 0x1ffffff) != 0) {
          this_00 = (LogicProgram *)(this->atomState_).state_.ebo_.buf;
          uVar10 = 0;
          do {
            uVar2 = *(uint *)(&(&rhs[1].super_PrgNode)[(uVar1 & 0x18000000) != 0].field_0x0 + uVar10
                             );
            uVar11 = uVar2 >> 2;
            if (((this->atomState_).state_.ebo_.size <= uVar11) ||
               ((*(byte *)((long)&(this_00->super_ProgramBuilder)._vptr_ProgramBuilder +
                          (ulong)uVar11) & 2U - ((uVar2 & 2) == 0)) == 0)) goto LAB_0014215c;
            uVar10 = uVar10 + 4;
          } while ((uVar1 & 0x1ffffff) << 2 != uVar10);
        }
        if ((uVar1 & 0x18000000) != 0x8000000) {
LAB_00142170:
          return *(uint *)&(rhs->super_PrgNode).field_0x4 & 0xfffffff;
        }
        if (sum != (WeightLit_t *)0x0) {
          if (!bVar9 && size != 0) {
            std::__introsort_loop<Potassco::WeightLit_t*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (sum,sum + uVar6,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
            this_00 = (LogicProgram *)sum;
            std::__final_insertion_sort<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_less_iter>
                      (sum,sum + uVar6);
            _Var8 = _Var7.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur;
          }
          local_40.first = sum;
          local_40.size = uVar6;
          bVar5 = equalLits(this_00,rhs,&local_40);
          bVar9 = true;
          if (bVar5) goto LAB_00142170;
        }
      }
LAB_0014215c:
      _Var3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           *(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *)
            pVar12.first.
            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>;
      pVar12.second.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
               (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var8._M_cur
      ;
      pVar12.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
      _M_cur = _Var3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
               _M_cur;
    } while (_Var3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
             _M_cur != (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
                       _Var8._M_cur);
  }
  return 0x40000000;
}

Assistant:

uint32 LogicProgram::findBody(uint32 hash, Body_t type, uint32 size, weight_t bound, Potassco::WeightLit_t* sum) {
	IndexRange bodies = index_->body.equal_range(hash);
	bool sorted = false;
	if (type == Body_t::Normal) { bound = static_cast<weight_t>(size); }
	for (IndexIter it = bodies.first; it != bodies.second; ++it) {
		const PrgBody& b = *getBody(it->second);
		if (!checkBody(b, type, size, bound) || !atomState_.inBody(b.goals_begin(), b.goals_end())) {
			continue;
		}
		else if (!b.hasWeights()) {
			return b.id();
		}
		else if (sum) {
			if (!sorted) {
				std::sort(sum, sum + size);
				sorted = true;
			}
			if (equalLits(b, Potassco::toSpan(sum, size))) { return b.id(); }
		}
	}
	return varMax;
}